

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver.cc
# Opt level: O0

void __thiscall xLearn::Solver::checker(Solver *this,HyperParam *hyper_param)

{
  bool bVar1;
  HyperParam *in_stack_ffffffffffffffb0;
  string *out;
  Checker *in_stack_ffffffffffffffb8;
  undefined1 local_31 [49];
  
  bVar1 = Checker::check_param(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
  if (!bVar1) {
    out = (string *)local_31;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)(local_31 + 1),"Arguments error",(allocator *)out);
    Color::print_error(out);
    std::__cxx11::string::~string((string *)(local_31 + 1));
    std::allocator<char>::~allocator((allocator<char> *)local_31);
    exit(0);
  }
  return;
}

Assistant:

void Solver::checker(HyperParam& hyper_param) {
  if (!checker_.check_param(hyper_param)) {
    Color::print_error("Arguments error");
    exit(0);
  }
}